

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Config * __thiscall Catch::Config::name_abi_cxx11_(Config *this)

{
  ulong uVar1;
  long in_RSI;
  undefined8 local_38;
  Config *this_local;
  
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    local_38 = (string *)(in_RSI + 0x58);
  }
  else {
    local_38 = (string *)(in_RSI + 0x78);
  }
  std::__cxx11::string::string((string *)this,local_38);
  return this;
}

Assistant:

virtual std::string name() const { return m_data.name.empty() ? m_data.processName : m_data.name; }